

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O3

void __thiscall
Fl_Multi_Browser::Fl_Multi_Browser(Fl_Multi_Browser *this,int X,int Y,int W,int H,char *L)

{
  Fl_Browser_::Fl_Browser_((Fl_Browser_ *)this,X,Y,W,H,L);
  (this->super_Fl_Browser).column_widths_ = no_columns;
  (this->super_Fl_Browser).full_height_ = 0;
  (this->super_Fl_Browser).format_char_ = '@';
  (this->super_Fl_Browser).column_char_ = '\t';
  (this->super_Fl_Browser).first = (FL_BLINE *)0x0;
  (this->super_Fl_Browser).last = (FL_BLINE *)0x0;
  (this->super_Fl_Browser).cache = (FL_BLINE *)0x0;
  (this->super_Fl_Browser).cacheline = 0;
  (this->super_Fl_Browser).lines = 0;
  (this->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Browser_00256958;
  (this->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget.type_ = '\x03';
  return;
}

Assistant:

Fl_Multi_Browser::Fl_Multi_Browser(int X,int Y,int W,int H,const char *L)
: Fl_Browser(X,Y,W,H,L) 
{
  type(FL_MULTI_BROWSER);
}